

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  Type TVar2;
  UnknownField *this;
  long lVar3;
  long lVar4;
  size_t sVar5;
  UnknownFieldSet *unknown_fields_00;
  UnknownField *field;
  int i;
  size_t size;
  int in_stack_ffffffffffffffcc;
  UnknownFieldSet *in_stack_ffffffffffffffd0;
  int local_14;
  size_t sVar6;
  
  sVar6 = 0;
  for (local_14 = 0; iVar1 = UnknownFieldSet::field_count((UnknownFieldSet *)0x471c4c),
      local_14 < iVar1; local_14 = local_14 + 1) {
    this = UnknownFieldSet::field(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    TVar2 = UnknownField::type(this);
    in_stack_ffffffffffffffd0 = (UnknownFieldSet *)(ulong)TVar2;
    switch(in_stack_ffffffffffffffd0) {
    case (UnknownFieldSet *)0x0:
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_VARINT);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      lVar3 = sVar5 + sVar6;
      UnknownField::varint(this);
      sVar6 = io::CodedOutputStream::VarintSize64((uint64)in_stack_ffffffffffffffd0);
      sVar6 = sVar6 + lVar3;
      break;
    case (UnknownFieldSet *)0x1:
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_FIXED32);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      sVar6 = sVar5 + sVar6 + 4;
      break;
    case (UnknownFieldSet *)0x2:
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_FIXED64);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      sVar6 = sVar5 + sVar6 + 8;
      break;
    case (UnknownFieldSet *)0x3:
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_LENGTH_DELIMITED);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      lVar3 = sVar5 + sVar6;
      UnknownField::length_delimited_abi_cxx11_(this);
      std::__cxx11::string::size();
      sVar6 = io::CodedOutputStream::VarintSize32(0);
      lVar3 = sVar6 + lVar3;
      UnknownField::length_delimited_abi_cxx11_(this);
      lVar4 = std::__cxx11::string::size();
      sVar6 = lVar4 + lVar3;
      break;
    case (UnknownFieldSet *)0x4:
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_START_GROUP);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      unknown_fields_00 = (UnknownFieldSet *)(sVar5 + sVar6);
      UnknownField::group(this);
      sVar6 = ComputeUnknownFieldsSize(unknown_fields_00);
      lVar3 = (long)&(unknown_fields_00->fields_).
                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar6;
      iVar1 = UnknownField::number(this);
      WireFormatLite::MakeTag(iVar1,WIRETYPE_END_GROUP);
      sVar6 = io::CodedOutputStream::VarintSize32(0);
      sVar6 = sVar6 + lVar3;
    }
  }
  return sVar6;
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}